

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_class_override_constructors
               (writer *w,TypeDef *type,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
               *factories)

{
  uint32_t *values;
  char *this;
  bool bVar1;
  reference __in;
  type *this_00;
  MethodDef *pMVar2;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *pvVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  char *local_228;
  anon_class_8_1_89897ddb_conflict1 local_220;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  anon_class_16_2_3ed68039_conflict3 local_208;
  anon_class_8_1_89897ddb_conflict1 local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1f0 [2];
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *local_1d0;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *params;
  method_signature signature;
  value_type *method;
  MethodDef __end2;
  MethodDef __begin2;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *__range2;
  type *factory;
  type *factory_name;
  _Self local_50;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  *__range1;
  char *format;
  string_view type_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  *factories_local;
  TypeDef *type_local;
  writer *w_local;
  
  type_name._M_str = (char *)factories;
  _format = winmd::reader::TypeDef::TypeName(type);
  this = type_name._M_str;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                    *)type_name._M_str);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
              *)this);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_50);
    if (!bVar1) break;
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>
           ::operator*(&__end1);
    ::std::get<0ul,std::__cxx11::string_const,cppwinrt::factory_info>(__in);
    this_00 = ::std::get<1ul,std::__cxx11::string_const,cppwinrt::factory_info>(__in);
    if ((this_00->composable & 1U) != 0) {
      winmd::reader::TypeDef::MethodList
                ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                 &__begin2.super_row_base<winmd::reader::MethodDef>.m_index,&this_00->type);
      values = &__begin2.super_row_base<winmd::reader::MethodDef>.m_index;
      pMVar2 = winmd::reader::begin<winmd::reader::MethodDef>
                         ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)values);
      __end2.super_row_base<winmd::reader::MethodDef>._8_8_ =
           (pMVar2->super_row_base<winmd::reader::MethodDef>).m_table;
      __begin2.super_row_base<winmd::reader::MethodDef>.m_table =
           *(table_base **)&(pMVar2->super_row_base<winmd::reader::MethodDef>).m_index;
      pMVar2 = winmd::reader::end<winmd::reader::MethodDef>
                         ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)values);
      method = (value_type *)(pMVar2->super_row_base<winmd::reader::MethodDef>).m_table;
      __end2.super_row_base<winmd::reader::MethodDef>.m_table =
           *(table_base **)&(pMVar2->super_row_base<winmd::reader::MethodDef>).m_index;
      while( true ) {
        bVar1 = winmd::reader::row_base<winmd::reader::MethodDef>::operator!=
                          ((row_base<winmd::reader::MethodDef> *)
                           &__end2.super_row_base<winmd::reader::MethodDef>.m_index,
                           (row_base<winmd::reader::MethodDef> *)&method);
        if (!bVar1) break;
        signature.m_return.super_row_base<winmd::reader::Param>._8_8_ =
             winmd::reader::row_base<winmd::reader::MethodDef>::operator*
                       ((row_base<winmd::reader::MethodDef> *)
                        &__end2.super_row_base<winmd::reader::MethodDef>.m_index);
        method_signature::method_signature
                  ((method_signature *)&params,
                   (MethodDef *)signature.m_return.super_row_base<winmd::reader::Param>._8_8_);
        pvVar3 = method_signature::params((method_signature *)&params);
        local_1d0 = pvVar3;
        sVar4 = std::
                vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                ::size(pvVar3);
        std::
        vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
        ::resize(pvVar3,sVar4 - 2);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_1f0,
                   "        %T(%)\n        {\n            % { [[maybe_unused]] auto winrt_impl_discarded = f.%(%%*this, this->m_inner); });\n        }\n"
                  );
        local_1f8 = bind<&cppwinrt::write_consume_params,_cppwinrt::method_signature_&>
                              ((method_signature *)&params);
        local_208 = bind<&cppwinrt::write_call_factory,_const_winmd::reader::TypeDef_&,_const_winmd::reader::TypeDef_&>
                              (type,&this_00->type);
        bVar5 = get_name((MethodDef *)signature.m_return.super_row_base<winmd::reader::Param>._8_8_)
        ;
        local_218 = bVar5;
        local_220 = bind<&cppwinrt::write_consume_args,_cppwinrt::method_signature_&>
                              ((method_signature *)&params);
        pvVar3 = method_signature::params((method_signature *)&params);
        bVar1 = std::
                vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                ::empty(pvVar3);
        local_228 = ", ";
        if (bVar1) {
          local_228 = "";
        }
        writer_base<cppwinrt::writer>::
        write<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_const_char_*>
                  (&w->super_writer_base<cppwinrt::writer>,local_1f0,
                   (basic_string_view<char,_std::char_traits<char>_> *)&format,&local_1f8,&local_208
                   ,&local_218,&local_220,&local_228);
        method_signature::~method_signature((method_signature *)&params);
        winmd::reader::row_base<winmd::reader::MethodDef>::operator++
                  ((row_base<winmd::reader::MethodDef> *)
                   &__end2.super_row_base<winmd::reader::MethodDef>.m_index);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void write_class_override_constructors(writer& w, TypeDef const& type, std::map<std::string, factory_info> const& factories)
    {
        auto type_name = type.TypeName();

        auto format = R"(        %T(%)
        {
            % { [[maybe_unused]] auto winrt_impl_discarded = f.%(%%*this, this->m_inner); });
        }
)";

        for (auto&& [factory_name, factory] : factories)
        {
            if (!factory.composable)
            {
                continue;
            }

            for (auto&& method : factory.type.MethodList())
            {
                method_signature signature{ method };
                auto& params = signature.params();
                params.resize(params.size() - 2);

                w.write(format,
                    type_name,
                    bind<write_consume_params>(signature),
                    bind<write_call_factory>(type, factory.type),
                    get_name(method),
                    bind<write_consume_args>(signature),
                    signature.params().empty() ? "" : ", ");
            }
        }
    }